

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O0

void __thiscall
websocketpp::connection<websocketpp::config::asio_client>::log_err<std::error_code>
          (connection<websocketpp::config::asio_client> *this,level l,char *msg,error_code *ec)

{
  level __fd;
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  element_type *this_00;
  string local_200 [32];
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream s;
  ostream local_1a0 [376];
  error_code *local_28;
  error_code *ec_local;
  char *msg_local;
  connection<websocketpp::config::asio_client> *pcStack_10;
  level l_local;
  connection<websocketpp::config::asio_client> *this_local;
  
  local_28 = ec;
  ec_local = (error_code *)msg;
  msg_local._4_4_ = l;
  pcStack_10 = this;
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,(char *)ec_local);
  poVar1 = std::operator<<(poVar1," error: ");
  pbVar2 = std::operator<<(poVar1,local_28);
  poVar1 = std::operator<<(pbVar2," (");
  std::error_code::message_abi_cxx11_(&local_1e0,local_28);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string((string *)&local_1e0);
  this_00 = std::
            __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_elog);
  __fd = msg_local._4_4_;
  std::__cxx11::stringstream::str();
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
            (this_00,__fd,local_200,(size_t)ec);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

void log_err(log::level l, char const * msg, error_type const & ec) {
        std::stringstream s;
        s << msg << " error: " << ec << " (" << ec.message() << ")";
        m_elog->write(l, s.str());
    }